

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

int __thiscall NNTreeImpl::remove(NNTreeImpl *this,char *__filename)

{
  bool bVar1;
  pointer pTVar2;
  undefined8 extraout_RAX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  QPDFObjectHandle local_98;
  undefined1 local_88 [8];
  iterator iter;
  QPDFObjectHandle *value_local;
  QPDFObjectHandle *key_local;
  NNTreeImpl *this_local;
  
  iter.ivalue.second.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = in_RDX;
  QPDFObjectHandle::QPDFObjectHandle(&local_98,(QPDFObjectHandle *)__filename);
  find((iterator *)local_88,this,&local_98,false);
  QPDFObjectHandle::~QPDFObjectHandle(&local_98);
  bVar1 = NNTreeIterator::valid((NNTreeIterator *)local_88);
  if (bVar1) {
    if (iter.ivalue.second.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pTVar2 = NNTreeIterator::operator->((NNTreeIterator *)local_88);
      this = (NNTreeImpl *)&pTVar2->second;
      QPDFObjectHandle::operator=
                ((QPDFObjectHandle *)
                 iter.ivalue.second.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
                 (QPDFObjectHandle *)this);
    }
    NNTreeIterator::remove((NNTreeIterator *)local_88,(char *)this);
    this_local._7_1_ = 1;
  }
  else {
    QTC::TC("qpdf","NNTree remove not found",0);
    this_local._7_1_ = 0;
  }
  NNTreeIterator::~NNTreeIterator((NNTreeIterator *)local_88);
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),this_local._7_1_);
}

Assistant:

bool
NNTreeImpl::remove(QPDFObjectHandle key, QPDFObjectHandle* value)
{
    auto iter = find(key, false);
    if (!iter.valid()) {
        QTC::TC("qpdf", "NNTree remove not found");
        return false;
    }
    if (value) {
        *value = iter->second;
    }
    iter.remove();
    return true;
}